

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall duckdb::Pipeline::ClearSource(Pipeline *this)

{
  _Head_base<0UL,_duckdb::GlobalSourceState_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->source_state).
       super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
       .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
  (this->source_state).
  super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
  .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl = (GlobalSourceState *)0x0
  ;
  if (_Var1._M_head_impl != (GlobalSourceState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_GlobalSourceState + 8))();
  }
  ::std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::clear(&(this->batch_indexes)._M_t);
  return;
}

Assistant:

void Pipeline::ClearSource() {
	source_state.reset();
	batch_indexes.clear();
}